

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::initialize(RenderTarget *this)

{
  uint uVar1;
  ulong uVar2;
  Uint64 UVar3;
  long *in_RDI;
  Rect<float> local_18;
  
  uVar1 = (**(code **)(*in_RDI + 0x10))();
  uVar2 = (**(code **)(*in_RDI + 0x10))();
  Rect<float>::Rect(&local_18,0.0,0.0,(float)uVar1,(float)(uVar2 >> 0x20));
  View::reset((View *)(in_RDI + 1),&local_18);
  memcpy(in_RDI + 0x16,in_RDI + 1,0xa6);
  *(undefined1 *)((long)in_RDI + 0x159) = 0;
  UVar3 = anon_unknown.dwarf_f9f2a::RenderTargetImpl::getUniqueId();
  in_RDI[0x3b] = UVar3;
  return;
}

Assistant:

void RenderTarget::initialize()
{
    // Setup the default and current views
    m_defaultView.reset(FloatRect(0, 0, static_cast<float>(getSize().x), static_cast<float>(getSize().y)));
    m_view = m_defaultView;

    // Set GL states only on first draw, so that we don't pollute user's states
    m_cache.glStatesSet = false;

    // Generate a unique ID for this RenderTarget to track
    // whether it is active within a specific context
    m_id = RenderTargetImpl::getUniqueId();
}